

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.c
# Opt level: O3

void pktin_free_queue_callback(void *vctx)

{
  PacketQueueNode *pPVar1;
  
  while (pktin_freeq_head.next != &pktin_freeq_head) {
    pPVar1 = pktin_freeq_head.next + -1;
    pktin_freeq_head.next = (pktin_freeq_head.next)->next;
    safefree(&pPVar1->formal_size);
  }
  pktin_freeq_head.prev = &pktin_freeq_head;
  return;
}

Assistant:

static void pktin_free_queue_callback(void *vctx)
{
    while (pktin_freeq_head.next != &pktin_freeq_head) {
        PacketQueueNode *node = pktin_freeq_head.next;
        PktIn *pktin = container_of(node, PktIn, qnode);
        pktin_freeq_head.next = node->next;
        sfree(pktin);
    }

    pktin_freeq_head.prev = &pktin_freeq_head;
}